

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O1

int ov_clear(OggVorbis_File *vf)

{
  _func_int_void_ptr *p_Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (vf != (OggVorbis_File *)0x0) {
    vorbis_block_clear(&vf->vb);
    vorbis_dsp_clear(&vf->vd);
    ogg_stream_clear(&vf->os);
    if ((vf->vi != (vorbis_info *)0x0) && (vf->links != 0)) {
      if (0 < vf->links) {
        lVar3 = 0;
        lVar4 = 0;
        lVar2 = 0;
        do {
          vorbis_info_clear((vorbis_info *)((long)&vf->vi->version + lVar3));
          vorbis_comment_clear((vorbis_comment *)((long)&vf->vc->user_comments + lVar4));
          lVar2 = lVar2 + 1;
          lVar4 = lVar4 + 0x20;
          lVar3 = lVar3 + 0x38;
        } while (lVar2 < vf->links);
      }
      free(vf->vi);
      free(vf->vc);
    }
    if (vf->dataoffsets != (ogg_int64_t *)0x0) {
      free(vf->dataoffsets);
    }
    if (vf->pcmlengths != (ogg_int64_t *)0x0) {
      free(vf->pcmlengths);
    }
    if (vf->serialnos != (long *)0x0) {
      free(vf->serialnos);
    }
    if (vf->offsets != (ogg_int64_t *)0x0) {
      free(vf->offsets);
    }
    ogg_sync_clear(&vf->oy);
    if ((vf->datasource != (void *)0x0) &&
       (p_Var1 = (vf->callbacks).close_func, p_Var1 != (_func_int_void_ptr *)0x0)) {
      (*p_Var1)(vf->datasource);
    }
    memset(vf,0,0x3b0);
  }
  return 0;
}

Assistant:

int ov_clear(OggVorbis_File *vf){
  if(vf){
    vorbis_block_clear(&vf->vb);
    vorbis_dsp_clear(&vf->vd);
    ogg_stream_clear(&vf->os);

    if(vf->vi && vf->links){
      int i;
      for(i=0;i<vf->links;i++){
        vorbis_info_clear(vf->vi+i);
        vorbis_comment_clear(vf->vc+i);
      }
      _ogg_free(vf->vi);
      _ogg_free(vf->vc);
    }
    if(vf->dataoffsets)_ogg_free(vf->dataoffsets);
    if(vf->pcmlengths)_ogg_free(vf->pcmlengths);
    if(vf->serialnos)_ogg_free(vf->serialnos);
    if(vf->offsets)_ogg_free(vf->offsets);
    ogg_sync_clear(&vf->oy);
    if(vf->datasource && vf->callbacks.close_func)
      (vf->callbacks.close_func)(vf->datasource);
    memset(vf,0,sizeof(*vf));
  }
#ifdef DEBUG_LEAKS
  _VDBG_dump();
#endif
  return(0);
}